

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceMemcpyCase::deinit(ReferenceMemcpyCase *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  ReferenceMemcpyCase *local_10;
  ReferenceMemcpyCase *this_local;
  
  local_10 = this;
  memset(&local_28,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_dstBuf,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::deinit
            (&this->
              super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            );
  return;
}

Assistant:

void ReferenceMemcpyCase::deinit (void)
{
	m_dstBuf = std::vector<deUint8>();
	BasicUploadCase<SingleOperationDuration>::deinit();
}